

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> * __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *this,
          linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>>const>::
    copy<testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>>const>
              ((linked_ptr<testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>>const> *)
               this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }